

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::long_apply_test::test(long_apply_test *this)

{
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  long_apply_test *local_10;
  long_apply_test *this_local;
  
  local_10 = this;
  compile_fixture::make_new_context(&this->super_compile_fixture,0x400,0x400,0x50,0x80);
  compile_fixture::build_string_to_symbol(&this->super_compile_fixture);
  compile_fixture::build_apply(&this->super_compile_fixture);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(apply + (list 1 2 3 4 5))",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("15",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd31,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"(define dm (list 8 7 6 5 4 3 2 1))",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(8 7 6 5 4 3 2 1)",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd32,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"(set! dm (cons 9 dm))",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(9 8 7 6 5 4 3 2 1)",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd33,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(set! dm (cons 10 dm))",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(10 9 8 7 6 5 4 3 2 1)",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd34,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(set! dm (cons 11 dm))",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(11 10 9 8 7 6 5 4 3 2 1)",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd35,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(set! dm (cons 12 dm))",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(12 11 10 9 8 7 6 5 4 3 2 1)",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd36,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(set! dm (cons 13 dm))",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd37,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(set! dm (cons 14 dm))",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd38,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(set! dm (cons 15 dm))",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd39,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(set! dm (cons 16 dm))",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd3a,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(set! dm (cons 17 dm))",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd3b,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(set! dm (cons 18 dm))",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd3c,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(set! dm (cons 19 dm))",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd3d,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"(apply + dm)",&local_409)
  ;
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("190",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd3e,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"(length dm)",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("19",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd3f,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"(set! dm (cons 20 dm))",&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd40,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"(apply + dm)",&local_4e1)
  ;
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("210",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd41,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"(length dm)",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("20",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd42,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(set! dm (cons 21 dm))",&local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd43,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(set! dm (cons 22 dm))",&local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd44,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"(set! dm (cons 23 dm))",&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(23 22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd45,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(set! dm (cons 24 dm))",&local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(24 23 22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd46,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"(set! dm (cons 25 dm))",&local_691);
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd47,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"(apply + dm)",&local_6d9)
  ;
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("325",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd48,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"(length dm)",&local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("25",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd49,"void skiwi::(anonymous namespace)::long_apply_test::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  return;
}

Assistant:

void test()
      {
      make_new_context(1024, 1024, 80, 128);
      build_string_to_symbol();
      build_apply();      
      TEST_EQ("15", run("(apply + (list 1 2 3 4 5))"));
      TEST_EQ("(8 7 6 5 4 3 2 1)", run("(define dm (list 8 7 6 5 4 3 2 1))"));
      TEST_EQ("(9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 9 dm))"));
      TEST_EQ("(10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 10 dm))"));
      TEST_EQ("(11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 11 dm))"));
      TEST_EQ("(12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 12 dm))"));
      TEST_EQ("(13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 13 dm))"));
      TEST_EQ("(14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 14 dm))"));
      TEST_EQ("(15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 15 dm))"));
      TEST_EQ("(16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 16 dm))"));
      TEST_EQ("(17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 17 dm))"));
      TEST_EQ("(18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 18 dm))"));
      TEST_EQ("(19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 19 dm))")); 
      TEST_EQ("190", run("(apply + dm)"));
      TEST_EQ("19", run("(length dm)"));
      TEST_EQ("(20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 20 dm))"));      
      TEST_EQ("210", run("(apply + dm)"));
      TEST_EQ("20", run("(length dm)"));
      TEST_EQ("(21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 21 dm))"));
      TEST_EQ("(22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 22 dm))"));
      TEST_EQ("(23 22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 23 dm))"));
      TEST_EQ("(24 23 22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 24 dm))"));
      TEST_EQ("(25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10 9 8 7 6 5 4 3 2 1)", run("(set! dm (cons 25 dm))"));     
      TEST_EQ("325", run("(apply + dm)"));
      TEST_EQ("25", run("(length dm)"));
      /*
      TEST_EQ("210", run("(apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("<lambda>", run("(define (rms nums) (sqrt (/ (apply + (map * nums nums))(length nums))))"));      
      TEST_EQ("11.9791", run("(rms (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("(define dm (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("dm"));
      TEST_EQ("11.9791", run("(rms dm)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("dm"));
      */
      }